

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::printInfo(Cache *this)

{
  size_type sVar1;
  reference pvVar2;
  long in_RDI;
  char *pcVar3;
  char *pcVar4;
  Block *b;
  int i;
  uint local_c;
  
  printf("----------- Cache Info ------------\n");
  printf("Cache Size: %d bytes\n",(ulong)*(uint *)(in_RDI + 0x30));
  printf("Block Size: %d bytes\n",(ulong)*(uint *)(in_RDI + 0x34));
  printf("Block Num: %d\n",(ulong)*(uint *)(in_RDI + 0x38));
  printf("Associativiy: %d\n",(ulong)*(uint *)(in_RDI + 0x3c));
  printf("Hit Latency: %d\n",(ulong)*(uint *)(in_RDI + 0x40));
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::size
                      ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18));
    if (sVar1 <= (ulong)(long)(int)local_c) break;
    pvVar2 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                        (long)(int)local_c);
    pcVar3 = "invalid";
    if ((pvVar2->valid & 1U) != 0) {
      pcVar3 = "valid";
    }
    pcVar4 = "unmodified";
    if ((pvVar2->dirty & 1U) != 0) {
      pcVar4 = "modified";
    }
    printf("Block %d:\ttag 0x%x\tid %d\t%s\t%s\tlast ref %d\n",(ulong)local_c,(ulong)pvVar2->tag,
           (ulong)pvVar2->id,pcVar3,pcVar4,pvVar2->last_reference);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Cache::printInfo() {
    printf("----------- Cache Info ------------\n");
    printf("Cache Size: %d bytes\n", this->policy.cache_size);
    printf("Block Size: %d bytes\n", this->policy.block_size);
    printf("Block Num: %d\n", this->policy.block_num);
    printf("Associativiy: %d\n", this->policy.associativity);
    printf("Hit Latency: %d\n", this->policy.hit_latency);
//    printf("Miss Latency: %d\n", this->policy.miss_latency);

    for (int i = 0; i < this->blocks.size(); i++) {
        const Block &b = this->blocks[i];
        printf("Block %d:\ttag 0x%x\tid %d\t%s\t%s\tlast ref %d\n", i, b.tag, b.id,
               b.valid ? "valid" : "invalid",
               b.dirty ? "modified" : "unmodified", b.last_reference);
    }

}